

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O0

Builder<prometheus::Histogram> * prometheus::BuildHistogram(void)

{
  Builder<prometheus::Histogram> *in_RDI;
  
  memset(in_RDI,0,0x70);
  detail::Builder<prometheus::Histogram>::Builder(in_RDI);
  return in_RDI;
}

Assistant:

detail::Builder<Histogram> BuildHistogram() { return {}; }